

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::ScissorAPI::compareScissorBoxes
          (ScissorAPI *this,vector<int,_std::allocator<int>_> *left,
          vector<int,_std::allocator<int>_> *right,GLchar *description,bool *out_result)

{
  size_t sVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  piVar2 = (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar2) {
    uVar4 = 0;
    do {
      if (piVar2[uVar4] !=
          (right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar4]) {
        local_1b0 = (undefined1  [8])((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Test case: ",0xb);
        if (description == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar1 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," Invalid values [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        std::ostream::operator<<
                  ((ostringstream *)&local_1a8,
                   (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        std::ostream::operator<<
                  ((ostringstream *)&local_1a8,
                   (right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        *out_result = false;
        piVar2 = (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)piVar3 - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void ScissorAPI::compareScissorBoxes(std::vector<GLint>& left, std::vector<GLint>& right, const GLchar* description,
									 bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;

			out_result = false;
		}
	}
}